

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9MuxProfile(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  bool bVar1;
  int iVar2;
  uint nLimit;
  char *pcVar3;
  uint fVerbose;
  int iVar4;
  char *pcVar5;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  nLimit = 0;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"Nmvh"), iVar4 = globalUtilOptind, iVar2 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar2 == -1) {
        p = pAbc->pGia;
        if (p != (Gia_Man_t *)0x0) {
          if (bVar1) {
            Gia_ManMuxProfiling(p);
          }
          else {
            Gia_ManProfileStructures(p,nLimit,fVerbose);
          }
          return 0;
        }
        pcVar3 = "Abc_CommandAbc9MuxProfile(): There is no AIG.\n";
        iVar4 = -1;
        goto LAB_00226770;
      }
      if (iVar2 != 0x6d) break;
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar2 != 0x4e) goto LAB_002266e2;
    if (argc <= globalUtilOptind) break;
    nLimit = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)nLimit < 0) {
LAB_002266e2:
      Abc_Print(-2,"usage: &profile [-N num] [-mvh]\n");
      Abc_Print(-2,"\t         profile gate structures appearing in the AIG\n");
      Abc_Print(-2,"\t-N num : limit on class size to show [default = %d]\n",(ulong)nLimit);
      pcVar5 = "yes";
      pcVar3 = "yes";
      if (!bVar1) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle profiling MUX structures [default = %s]\n",pcVar3);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
      pcVar3 = "\t-h     : print the command usage\n";
      iVar4 = -2;
LAB_00226770:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_002266e2;
}

Assistant:

int Abc_CommandAbc9MuxProfile( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManMuxProfiling( Gia_Man_t * p );
    extern void Gia_ManProfileStructures( Gia_Man_t * p, int nLimit, int fVerbose );
    int c, fMuxes = 0, nLimit = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLimit < 0 )
                goto usage;
            break;
        case 'm':
            fMuxes ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MuxProfile(): There is no AIG.\n" );
        return 1;
    }
    if ( fMuxes )
        Gia_ManMuxProfiling( pAbc->pGia );
    else
        Gia_ManProfileStructures( pAbc->pGia, nLimit, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &profile [-N num] [-mvh]\n" );
    Abc_Print( -2, "\t         profile gate structures appearing in the AIG\n" );
    Abc_Print( -2, "\t-N num : limit on class size to show [default = %d]\n", nLimit );
    Abc_Print( -2, "\t-m     : toggle profiling MUX structures [default = %s]\n", fMuxes? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}